

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

void google::MaybeAppendWithLength(State *state,char *str,int length)

{
  byte bVar1;
  
  if ((0 < length) && (state->append != false)) {
    bVar1 = *str;
    if (bVar1 == 0x3c) {
      bVar1 = 0x3c;
      if ((state->out_begin < state->out_cur) && (state->out_cur[-1] == '<')) {
        Append(state," ",1);
        bVar1 = *str;
      }
    }
    if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      state->prev_name = state->out_cur;
      state->prev_name_length = length;
    }
    Append(state,str,length);
    return;
  }
  return;
}

Assistant:

static void MaybeAppendWithLength(State *state, const char * const str,
                                  const int length) {
  if (state->append && length > 0) {
    // Append a space if the output buffer ends with '<' and "str"
    // starts with '<' to avoid <<<.
    if (str[0] == '<' && state->out_begin < state->out_cur  &&
        state->out_cur[-1] == '<') {
      Append(state, " ", 1);
    }
    // Remember the last identifier name for ctors/dtors.
    if (IsAlpha(str[0]) || str[0] == '_') {
      state->prev_name = state->out_cur;
      state->prev_name_length = length;
    }
    Append(state, str, length);
  }
}